

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

void __thiscall crnlib::dxt_image::flip_row(dxt_image *this,uint y)

{
  uint8 uVar1;
  uint8 uVar2;
  element_type eVar3;
  long lVar4;
  uint value;
  uint value_00;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  uint y_1;
  long lVar10;
  uint y_2;
  uint y_00;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  uint x;
  uint x_00;
  uint uVar18;
  dxt3_block *this_00;
  ulong uVar19;
  element tmp [2];
  dxt3_block local_68 [3];
  long local_50;
  ulong local_48;
  dxt_image *local_40;
  ulong local_38;
  
  if (this->m_blocks_x != 0) {
    iVar14 = ~y + this->m_blocks_y;
    local_48 = 0;
    local_40 = this;
    do {
      uVar5 = (ulong)this->m_num_elements_per_block;
      if (this->m_num_elements_per_block != 0) {
        local_38 = 0;
        do {
          local_68[0].m_alpha =
               *&this->m_pElements
                 [(this->m_blocks_x * y + (int)local_48) * (int)uVar5 + (int)local_38].m_bytes;
          local_68[1].m_alpha =
               (uint8  [8])
               *(undefined8 *)
                this->m_pElements
                [(this->m_blocks_x * iVar14 + (int)local_48) * (int)uVar5 + (int)local_38].m_bytes;
          lVar9 = 0;
          do {
            eVar3 = this->m_element_type[local_38];
            local_50 = lVar9;
            if (eVar3 == cAlphaDXT5) {
              iVar12 = 0x24;
              iVar13 = 0;
              iVar8 = 0;
              do {
                iVar16 = 0;
                do {
                  uVar19 = (ulong)((uint)(iVar13 + iVar16) >> 3);
                  uVar1 = local_68[lVar9].m_alpha[uVar19 + 2];
                  uVar2 = local_68[lVar9].m_alpha[uVar19 + 3];
                  bVar6 = (byte)(iVar13 + iVar16) & 7;
                  uVar17 = iVar12 + iVar16;
                  uVar5 = (ulong)(uVar17 >> 3);
                  uVar18 = (uint)local_68[lVar9].m_alpha[uVar5 + 2];
                  if (uVar17 < 0x28) {
                    uVar18 = (uint)CONCAT11(local_68[lVar9].m_alpha[uVar5 + 3],
                                            local_68[lVar9].m_alpha[uVar5 + 2]);
                  }
                  bVar7 = (byte)uVar17 & 7;
                  *(ushort *)(local_68[lVar9].m_alpha + uVar19 + 2) =
                       (ushort)((uVar18 >> bVar7 & 7) << bVar6) |
                       ~(ushort)(7 << bVar6) & CONCAT11(local_68[lVar9].m_alpha[uVar19 + 3],uVar1);
                  uVar18 = (uint)local_68[lVar9].m_alpha[uVar5 + 2];
                  if (uVar17 < 0x28) {
                    uVar18 = (uint)CONCAT11(local_68[lVar9].m_alpha[uVar5 + 3],
                                            local_68[lVar9].m_alpha[uVar5 + 2]);
                  }
                  uVar18 = ((ushort)(CONCAT11(uVar2,uVar1) >> bVar6) & 7) << bVar7 |
                           ~(7 << bVar7) & uVar18;
                  local_68[lVar9].m_alpha[uVar5 + 2] = (uint8)uVar18;
                  if (uVar17 < 0x28) {
                    local_68[lVar9].m_alpha[uVar5 + 3] = (uint8)(uVar18 >> 8);
                  }
                  iVar16 = iVar16 + 3;
                } while (iVar16 != 0xc);
                iVar8 = iVar8 + 1;
                iVar12 = iVar12 + -0xc;
                iVar13 = iVar13 + 0xc;
              } while (iVar8 != 2);
            }
            else if (eVar3 == cAlphaDXT3) {
              this_00 = local_68 + lVar9;
              y_00 = 0;
              do {
                x_00 = 0;
                do {
                  value = dxt3_block::get_alpha(this_00,x_00,y_00,false);
                  value_00 = dxt3_block::get_alpha(this_00,x_00,3 - y_00,false);
                  dxt3_block::set_alpha(this_00,x_00,y_00,value_00,false);
                  dxt3_block::set_alpha(this_00,x_00,3 - y_00,value,false);
                  x_00 = x_00 + 1;
                } while (x_00 != 4);
                y_00 = y_00 + 1;
              } while (y_00 != 2);
            }
            else if (eVar3 == cColorDXT1) {
              lVar4 = lVar9 * 8 + -100;
              lVar10 = 0;
              do {
                lVar11 = 3 - lVar10;
                iVar8 = 0;
                do {
                  bVar6 = local_68[lVar9].m_alpha[lVar10 + 4];
                  bVar7 = (byte)iVar8;
                  bVar15 = ~(byte)(3 << (bVar7 & 0x1f));
                  local_68[lVar9].m_alpha[lVar10 + 4] =
                       (byte)((*(byte *)((long)local_68 + lVar11 + lVar4 + 0x68) >> (bVar7 & 0x1f) &
                              3) << (bVar7 & 0x1f)) | bVar6 & bVar15;
                  *(byte *)((long)local_68 + lVar11 + lVar4 + 0x68) =
                       (byte)((bVar6 >> (bVar7 & 0x1f) & 3) << (bVar7 & 0x1f)) |
                       bVar15 & *(byte *)((long)local_68 + lVar11 + lVar4 + 0x68);
                  iVar8 = iVar8 + 2;
                } while (iVar8 != 8);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 2);
            }
            lVar9 = local_50 + 1;
            this = local_40;
          } while (local_50 == 0);
          *&local_40->m_pElements
            [(local_40->m_blocks_x * y + (int)local_48) * local_40->m_num_elements_per_block +
             (int)local_38].m_bytes = local_68[1].m_alpha;
          *&local_40->m_pElements
            [(local_40->m_blocks_x * iVar14 + (int)local_48) * local_40->m_num_elements_per_block +
             (int)local_38].m_bytes = local_68[0].m_alpha;
          local_38 = local_38 + 1;
          uVar5 = (ulong)local_40->m_num_elements_per_block;
        } while (local_38 < uVar5);
      }
      uVar17 = (int)local_48 + 1;
      local_48 = (ulong)uVar17;
    } while (uVar17 < this->m_blocks_x);
  }
  return;
}

Assistant:

void dxt_image::flip_row(uint y)
    {
        const uint other_y = (m_blocks_y - 1) - y;
        for (uint x = 0; x < m_blocks_x; x++)
        {
            for (uint e = 0; e < get_elements_per_block(); e++)
            {
                element tmp[2] = { get_element(x, y, e), get_element(x, other_y, e) };

                for (uint i = 0; i < 2; i++)
                {
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp[i])->flip_y();
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp[i])->flip_y();
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp[i])->flip_y();
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                }

                get_element(x, y, e) = tmp[1];
                get_element(x, other_y, e) = tmp[0];
            }
        }
    }